

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

ON_RevSurface * ON_RevSurface::Cast(ON_Object *p)

{
  bool bVar1;
  ON_RevSurface *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_RevSurface_class_rtti);
    pOVar2 = (ON_RevSurface *)0x0;
    if (bVar1) {
      pOVar2 = (ON_RevSurface *)p;
    }
    return pOVar2;
  }
  return (ON_RevSurface *)0x0;
}

Assistant:

void ON_RevSurface::DestroyRuntimeCache( bool bDelete )
{
  ON_Surface::DestroyRuntimeCache(bDelete);
  if ( 0 != m_curve )
    m_curve->DestroyRuntimeCache(bDelete);
  // 15 August 2003 Dale Lear
  //    Added the call to destroy m_bbox.
  m_bbox.Destroy();
}